

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O1

int __thiscall sort_5_4::quick_sort_1(sort_5_4 *this,int *a,int mid,int low,int high)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int k;
  long lVar5;
  int iVar6;
  void *__dest;
  undefined8 uStack_40;
  int aiStack_38 [2];
  
  lVar3 = -((ulong)(uint)(low - mid) * 4 + 0xf & 0xfffffffffffffff0);
  __dest = (void *)((long)aiStack_38 + lVar3);
  lVar5 = (long)mid;
  if (mid <= low) {
    aiStack_38[1] = low;
    *(undefined8 *)((long)&uStack_40 + lVar3) = 0x103a15;
    memcpy(__dest,this + lVar5 * 4,(ulong)(uint)(low - mid) * 4 + 4);
    low = aiStack_38[1];
  }
  iVar4 = (int)a + 1;
  iVar6 = mid;
  do {
    if ((int)a < iVar6) {
      *(undefined4 *)(this + lVar5 * 4) = *(undefined4 *)((long)__dest + (long)(iVar4 - mid) * 4);
LAB_00103a35:
      iVar4 = iVar4 + 1;
    }
    else {
      iVar1 = *(int *)((long)__dest + (long)(iVar6 - mid) * 4);
      if ((iVar4 <= low) &&
         (iVar2 = *(int *)((long)__dest + (long)(iVar4 - mid) * 4), iVar2 < iVar1)) {
        *(int *)(this + lVar5 * 4) = iVar2;
        goto LAB_00103a35;
      }
      *(int *)(this + lVar5 * 4) = iVar1;
      iVar6 = iVar6 + 1;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int merge_1(int *a, int mid, int low, int high) {
        int i = low, j = mid + 1, t[high - low];
        for (int k = low; k <= high; k++)
            t[k - low] = a[k];

        for (int k = low; k <= high; k++) {
            if (i > mid) {
                a[k] = t[j - low];
                j++;
            } else if (j > high) {
                a[k] = t[i - low];
                i++;
            } else if (t[i - low] > t[j - low]) {
                a[k] = t[j - low];
                j++;
            } else {
                a[k] = t[i - low];
                i++;
            }
        }

    }